

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall spirv_cross::Compiler::add_active_interface_variable(Compiler *this,uint32_t var_id)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  uint32_t uVar3;
  __node_base_ptr p_Var4;
  TypedID<(spirv_cross::Types)2> *pTVar5;
  ulong __code;
  __node_gen_type __node_gen;
  
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
            ();
  uVar3 = ParsedIR::get_spirv_version(&this->ir);
  if (0x103ff < uVar3) {
    __code = (ulong)(this->ir).default_entry_point.id;
    p_Var4 = ::std::
             _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->ir).entry_points._M_h,
                        __code % (this->ir).entry_points._M_h._M_bucket_count,
                        &(this->ir).default_entry_point,__code);
    p_Var1 = p_Var4->_M_nxt;
    pTVar5 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                       (p_Var1[0xb]._M_nxt,
                        (long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4);
    if (pTVar5 == (TypedID<(spirv_cross::Types)2> *)
                  ((long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4)) {
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)(p_Var1 + 0xb),
                 (size_t)((long)&(p_Var1[0xc]._M_nxt)->_M_nxt + 1));
      p_Var2 = p_Var1[0xc]._M_nxt;
      *(uint32_t *)((long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var2 * 4) = var_id;
      p_Var1[0xc]._M_nxt = (_Hash_node_base *)((long)&p_Var2->_M_nxt + 1);
    }
  }
  return;
}

Assistant:

void Compiler::add_active_interface_variable(uint32_t var_id)
{
	active_interface_variables.insert(var_id);

	// In SPIR-V 1.4 and up we must also track the interface variable in the entry point.
	if (ir.get_spirv_version() >= 0x10400)
	{
		auto &vars = get_entry_point().interface_variables;
		if (find(begin(vars), end(vars), VariableID(var_id)) == end(vars))
			vars.push_back(var_id);
	}
}